

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O3

int lsrkStep_AccessARKODEStepMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeLSRKStepMem *step_mem)

{
  int line;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    line = 0x84c;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    if (*(ARKodeLSRKStepMem *)((long)arkode_mem + 0x88) != (ARKodeLSRKStepMem)0x0) {
      *step_mem = *(ARKodeLSRKStepMem *)((long)arkode_mem + 0x88);
      return 0;
    }
    msgfmt = "Time step module memory is NULL.";
    line = 0x855;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                  ,msgfmt);
  return -0x15;
}

Assistant:

int lsrkStep_AccessARKODEStepMem(void* arkode_mem, const char* fname,
                                 ARKodeMem* ark_mem, ARKodeLSRKStepMem* step_mem)
{
  /* access ARKodeMem structure */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  *ark_mem = (ARKodeMem)arkode_mem;

  /* access ARKodeLSRKStepMem structure */
  if ((*ark_mem)->step_mem == NULL)
  {
    arkProcessError(*ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LSRKSTEP_NO_MEM);
    return ARK_MEM_NULL;
  }
  *step_mem = (ARKodeLSRKStepMem)(*ark_mem)->step_mem;
  return ARK_SUCCESS;
}